

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  int *piVar1;
  ImGuiID IVar2;
  ImGuiID node_id;
  char *window_name;
  char *pcVar3;
  undefined8 *puVar4;
  ImGuiContext *pIVar5;
  uint *puVar6;
  ImU32 key;
  int iVar7;
  ImU32 IVar8;
  int *piVar9;
  void *pvVar10;
  ImU32 *pIVar11;
  ulong uVar12;
  ImU32 *pIVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ImGuiContext *g;
  ImVector<unsigned_int> src_windows;
  ImVector<unsigned_int> node_remap_pairs;
  int *local_80;
  long local_78;
  int local_68;
  int *piStack_60;
  ImVector<unsigned_int> local_58;
  ImVector<const_char_*> *local_40;
  char *local_38;
  
  local_58.Size = 0;
  local_58.Capacity = 0;
  local_58.Data = (uint *)0x0;
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,&local_58);
  local_68 = 0;
  piStack_60 = (int *)0x0;
  if (*(int *)in_window_remap_pairs < 1) {
    local_78 = 0;
    iVar16 = local_58.Size;
  }
  else {
    local_80 = (int *)0x0;
    iVar17 = 0;
    local_78 = 0;
    lVar14 = 0;
    local_40 = in_window_remap_pairs;
    do {
      local_38 = *(char **)(*(long *)(in_window_remap_pairs + 8) + lVar14 * 8);
      window_name = *(char **)(*(long *)(in_window_remap_pairs + 8) + 8 + lVar14 * 8);
      key = ImHashStr(local_38,0,0);
      piVar9 = local_80;
      iVar16 = iVar17;
      if ((int)local_78 == iVar17) {
        if (iVar17 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar17 / 2 + iVar17;
        }
        iVar16 = iVar17 + 1;
        if (iVar17 + 1 < iVar7) {
          iVar16 = iVar7;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar9 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar9 = *piVar9 + 1;
        }
        piVar9 = (int *)(*GImAllocatorAllocFunc)((long)iVar16 << 2,GImAllocatorUserData);
        in_window_remap_pairs = local_40;
        piStack_60 = piVar9;
        if (local_80 != (int *)0x0) {
          memcpy(piVar9,local_80,(long)iVar17 << 2);
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(local_80,GImAllocatorUserData);
          in_window_remap_pairs = local_40;
        }
      }
      iVar17 = iVar16;
      piVar9[(int)local_78] = key;
      pIVar5 = GImGui;
      local_78 = (long)local_68 + 1;
      local_68 = (int)local_78;
      pvVar10 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
      if (pvVar10 == (void *)0x0) {
        pcVar3 = (pIVar5->SettingsWindows).Buf.Data;
        IVar8 = 0;
        if (pcVar3 != (char *)0x0) {
          pIVar11 = (ImU32 *)(pcVar3 + 4);
          pIVar13 = pIVar11;
          do {
            if (*pIVar13 == key) {
              IVar8 = pIVar13[5];
              break;
            }
            pIVar13 = (ImU32 *)((long)pIVar13 + (long)(int)pIVar13[-1]);
          } while (pIVar13 != (ImU32 *)((long)(pIVar5->SettingsWindows).Buf.Size + (long)pIVar11));
        }
      }
      else {
        IVar8 = *(ImU32 *)((long)pvVar10 + 0x420);
      }
      iVar16 = local_58.Size;
      if (0 < local_58.Size) {
        uVar12 = 0;
        do {
          if (local_58.Data[uVar12] == IVar8) {
            IVar2 = *(ImGuiID *)((long)local_58.Data + ((uVar12 & 0xffffffff) << 2 | 4));
            if (IVar2 != 0) {
              DockBuilderDockWindow(window_name,IVar2);
              goto LAB_00168e2a;
            }
            break;
          }
          uVar12 = uVar12 + 2;
        } while ((int)uVar12 < local_58.Size);
      }
      DockBuilderCopyWindowSettings(local_38,window_name);
LAB_00168e2a:
      lVar14 = lVar14 + 2;
      local_80 = piVar9;
    } while ((int)lVar14 < *(int *)in_window_remap_pairs);
  }
  puVar6 = local_58.Data;
  if (0 < iVar16) {
    lVar14 = 0;
    do {
      IVar2 = puVar6[lVar14];
      if (IVar2 != 0) {
        node_id = puVar6[lVar14 + 1];
        pvVar10 = ImGuiStorage::GetVoidPtr(&GImGui->DockContext->Nodes,IVar2);
        iVar17 = *(int *)((long)pvVar10 + 0x28);
        if (0 < iVar17) {
          lVar15 = 0;
          do {
            puVar4 = *(undefined8 **)(*(long *)((long)pvVar10 + 0x30) + lVar15 * 8);
            piVar9 = piStack_60;
            do {
              if (piStack_60 + local_78 <= piVar9) {
                DockBuilderDockWindow((char *)*puVar4,node_id);
                iVar17 = *(int *)((long)pvVar10 + 0x28);
                break;
              }
              iVar7 = *piVar9;
              piVar9 = piVar9 + 1;
            } while (iVar7 != *(int *)(puVar4 + 1));
            lVar15 = lVar15 + 1;
          } while (lVar15 < iVar17);
        }
      }
      lVar14 = lVar14 + 2;
    } while ((int)lVar14 < iVar16);
  }
  if (piStack_60 != (int *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar9 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar9 = *piVar9 + -1;
    }
    (*GImAllocatorFreeFunc)(piStack_60,GImAllocatorUserData);
  }
  if (local_58.Data != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar9 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar9 = *piVar9 + -1;
    }
    (*GImAllocatorFreeFunc)(local_58.Data,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}